

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QRectF * __thiscall QGraphicsItem::mapRectFromScene(QGraphicsItem *this,QRectF *rect)

{
  bool bVar1;
  QGraphicsItemPrivate *pQVar2;
  qreal in_RDX;
  long in_RSI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  qreal qVar3;
  QGraphicsItemPrivate *in_stack_ffffffffffffff70;
  QRectF *this_00;
  bool local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
            ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *)
             (in_RSI + 8));
  bVar1 = QGraphicsItemPrivate::hasTranslateOnlySceneTransform(in_stack_ffffffffffffff70);
  if (bVar1) {
    pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RSI + 8));
    qVar3 = QTransform::dx(&pQVar2->sceneTransform);
    qVar3 = -qVar3;
    pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RSI + 8));
    QTransform::dy(&pQVar2->sceneTransform);
    QRectF::translated(this_00,qVar3,in_RDX);
  }
  else {
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *
               )(in_RSI + 8));
    QTransform::inverted(local_58);
    QTransform::mapRect((QRectF *)this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QGraphicsItem::mapRectFromScene(const QRectF &rect) const
{
    if (d_ptr->hasTranslateOnlySceneTransform())
        return rect.translated(-d_ptr->sceneTransform.dx(), -d_ptr->sceneTransform.dy());
    return d_ptr->sceneTransform.inverted().mapRect(rect);
}